

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

void Abc_NodeCheckDist1Free(Abc_Obj_t *pNode)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  
  pcVar5 = (char *)(pNode->field_5).pData;
  if (*pcVar5 != '\0') {
    uVar4 = (pNode->vFanins).nSize;
    lVar1 = (long)(int)uVar4 + 3;
    pcVar6 = pcVar5;
    cVar3 = *pcVar5;
    pcVar7 = pcVar5;
    do {
      while (cVar3 != '\0') {
        if (pcVar7 != pcVar6) {
          if ((int)uVar4 < 1) {
LAB_00843556:
            __assert_fail("Counter > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                          ,0x26c,"void Abc_NodeCheckDist1Free(Abc_Obj_t *)");
          }
          uVar8 = 0;
          uVar9 = 0;
          do {
            uVar9 = uVar9 + (pcVar7[uVar8] != pcVar6[uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar4 != uVar8);
          if (uVar9 < 2) goto LAB_00843556;
        }
        pcVar2 = pcVar6 + lVar1;
        pcVar6 = pcVar6 + lVar1;
        cVar3 = *pcVar2;
      }
      pcVar2 = pcVar7 + lVar1;
      pcVar7 = pcVar7 + lVar1;
      pcVar6 = pcVar5;
      cVar3 = *pcVar5;
    } while (*pcVar2 != '\0');
  }
  return;
}

Assistant:

void Abc_NodeCheckDist1Free( Abc_Obj_t * pNode )
{
    char * pSop = (char *)pNode->pData;
    char * pCube, * pCube2;
    int i, nVars = Abc_ObjFaninNum(pNode);
    Abc_SopForEachCube( pSop, nVars, pCube )
    Abc_SopForEachCube( pSop, nVars, pCube2 )
    {
        int Counter = 0;
        if ( pCube == pCube2 )
            continue;
        for ( i = 0; i < nVars; i++ )
            if ( pCube[i] != pCube2[i] )
                Counter++;
        assert( Counter > 1 );
    }
}